

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::StyledWriter::writeArrayValue(StyledWriter *this,Value *value)

{
  bool bVar1;
  ArrayIndex AVar2;
  reference pvVar3;
  size_type sVar4;
  size_type local_b8;
  size_t index_1;
  String local_a8;
  Value *local_88;
  Value *childValue;
  ArrayIndex index;
  bool hasChildValue;
  undefined1 local_55;
  bool isArrayMultiLine;
  allocator local_41;
  String local_40;
  ulong local_20;
  size_t size;
  Value *value_local;
  StyledWriter *this_local;
  
  size = (size_t)value;
  value_local = (Value *)this;
  AVar2 = Value::size(value);
  local_20 = (ulong)AVar2;
  if (local_20 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"[]",&local_41);
    pushValue(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    local_55 = isMultilineArray(this,(Value *)size);
    if ((bool)local_55) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&index,"[",(allocator *)((long)&childValue + 7));
      writeWithIndent(this,(String *)&index);
      std::__cxx11::string::~string((string *)&index);
      std::allocator<char>::~allocator((allocator<char> *)((long)&childValue + 7));
      indent(this);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->childValues_);
      childValue._6_1_ = (bVar1 ^ 0xffU) & 1;
      childValue._0_4_ = 0;
      while( true ) {
        local_88 = Value::operator[]((Value *)size,(uint)childValue);
        writeCommentBeforeValue(this,local_88);
        if ((childValue._6_1_ & 1) == 0) {
          writeIndent(this);
          writeValue(this,local_88);
        }
        else {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->childValues_,(ulong)(uint)childValue);
          writeWithIndent(this,pvVar3);
        }
        childValue._0_4_ = (uint)childValue + 1;
        if ((uint)childValue == local_20) break;
        std::__cxx11::string::operator+=((string *)&this->document_,',');
        writeCommentAfterValueOnSameLine(this,local_88);
      }
      writeCommentAfterValueOnSameLine(this,local_88);
      unindent(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a8,"]",(allocator *)((long)&index_1 + 7));
      writeWithIndent(this,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&index_1 + 7));
    }
    else {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->childValues_);
      if (sVar4 != local_20) {
        __assert_fail("childValues_.size() == size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/external/jsoncpp/src/lib_json/json_writer.cpp"
                      ,0x222,"void Json::StyledWriter::writeArrayValue(const Value &)");
      }
      std::__cxx11::string::operator+=((string *)&this->document_,"[ ");
      for (local_b8 = 0; local_b8 < local_20; local_b8 = local_b8 + 1) {
        if (local_b8 != 0) {
          std::__cxx11::string::operator+=((string *)&this->document_,", ");
        }
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->childValues_,local_b8);
        std::__cxx11::string::operator+=((string *)&this->document_,(string *)pvVar3);
      }
      std::__cxx11::string::operator+=((string *)&this->document_," ]");
    }
  }
  return;
}

Assistant:

void StyledWriter::writeArrayValue(const Value& value) {
  size_t size = value.size();
  if (size == 0)
    pushValue("[]");
  else {
    bool isArrayMultiLine = isMultilineArray(value);
    if (isArrayMultiLine) {
      writeWithIndent("[");
      indent();
      bool hasChildValue = !childValues_.empty();
      ArrayIndex index = 0;
      for (;;) {
        const Value& childValue = value[index];
        writeCommentBeforeValue(childValue);
        if (hasChildValue)
          writeWithIndent(childValues_[index]);
        else {
          writeIndent();
          writeValue(childValue);
        }
        if (++index == size) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        document_ += ',';
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("]");
    } else // output on a single line
    {
      assert(childValues_.size() == size);
      document_ += "[ ";
      for (size_t index = 0; index < size; ++index) {
        if (index > 0)
          document_ += ", ";
        document_ += childValues_[index];
      }
      document_ += " ]";
    }
  }
}